

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeBuiltinVarInstance *this)

{
  pointer pSVar1;
  UVec3 *pUVar2;
  uint *puVar3;
  uint *puVar4;
  ostringstream *poVar5;
  uint uVar6;
  pointer pSVar7;
  DeviceInterface *pDVar8;
  VkDevice pVVar9;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  TestContext *pTVar10;
  undefined8 obj;
  undefined8 commandBuffer;
  Allocation *pAVar11;
  int i;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ostream *this_01;
  long lVar15;
  Allocator *pAVar16;
  DescriptorSetLayoutBuilder *pDVar17;
  const_iterator cVar18;
  DescriptorPoolBuilder *pDVar19;
  DescriptorSetUpdateBuilder *pDVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong bufferSize;
  TestStatus *pTVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  bool bVar28;
  int local_5b4;
  int local_5a0;
  uint local_59c;
  uint local_598;
  uint local_594;
  uint local_590;
  UVec3 resValue;
  UVec3 refGlobalID;
  UVec3 globalSize;
  UVec3 refValue;
  UVec3 refLocalID;
  UVec3 refGroupID;
  long local_518;
  pointer pWStack_510;
  pointer local_508;
  VkAllocationCallbacks *pVStack_500;
  TestStatus *local_4f0;
  pointer local_4e8;
  pointer local_4e0;
  VkAllocationCallbacks *local_4d8;
  ulong local_4d0;
  VkBufferMemoryBarrier bufferBarrier;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_480;
  VkDescriptorSetLayout local_468;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_460;
  size_t local_448;
  void *local_440;
  VkCommandPool local_438;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_430;
  VkDescriptorPool local_418;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_410;
  VkPipeline local_3f8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_3f0;
  VkShaderModule local_3d8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3d0;
  Vector<unsigned_int,_3> res_3;
  pointer local_3a8;
  VkCommandPool VStack_3a0;
  pointer local_390;
  pointer local_388;
  pointer local_378;
  ios_base local_340 [264];
  Buffer local_238;
  Buffer local_208;
  VkDescriptorBufferInfo uniformDescriptorInfo;
  VkDescriptorBufferInfo resultDescriptorInfo;
  ostringstream program_name;
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program_name);
  this_01 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&program_name,
                       compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_,DAT_00d76f60);
  std::ostream::operator<<(this_01,this->m_subCaseNdx);
  pSVar7 = (this->m_subCases).
           super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = pSVar7 + this->m_subCaseNdx;
  pUVar2 = &pSVar7[this->m_subCaseNdx].m_numWorkGroups;
  globalSize.m_data[2] = 0;
  globalSize.m_data[0] = 0;
  globalSize.m_data[1] = 0;
  lVar15 = 0;
  do {
    globalSize.m_data[lVar15] =
         (pSVar1->m_numWorkGroups).m_data[lVar15] * (pSVar1->m_localSize).m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  local_4d0 = globalSize.m_data._0_8_ & 0xffffffff;
  uVar21 = globalSize.m_data[1] * globalSize.m_data[0];
  uVar12 = glu::getDataTypeScalarSize(this->m_varType);
  uVar25 = (pSVar1->m_localSize).m_data[1];
  uVar14 = (pSVar1->m_localSize).m_data[0];
  uVar26 = (pSVar1->m_localSize).m_data[2];
  uVar23 = (pSVar1->m_numWorkGroups).m_data[0];
  uVar6 = (pSVar1->m_numWorkGroups).m_data[1];
  uVar13 = this->m_varType - TYPE_UINT;
  local_5a0 = 0;
  if (uVar13 < 4) {
    local_5a0 = *(int *)(&DAT_00b3a2f0 + (ulong)uVar13 * 4);
  }
  uVar13 = (pSVar1->m_numWorkGroups).m_data[2];
  pDVar8 = this->m_vki;
  pVVar9 = this->m_device;
  local_4f0 = __return_storage_ptr__;
  pAVar16 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&res_3,8,0x10);
  compute::Buffer::Buffer
            (&local_208,pDVar8,pVVar9,pAVar16,(VkBufferCreateInfo *)&res_3,(MemoryRequirement)0x1);
  pDVar8 = this->m_vki;
  pVVar9 = this->m_device;
  pAVar16 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  bufferSize = (ulong)(local_5a0 * uVar25 * uVar14 * uVar26 * uVar23 * uVar6 * uVar13);
  makeBufferCreateInfo((VkBufferCreateInfo *)&res_3,bufferSize,0x20);
  compute::Buffer::Buffer
            (&local_238,pDVar8,pVVar9,pAVar16,(VkBufferCreateInfo *)&res_3,(MemoryRequirement)0x1);
  *(ulong *)(local_208.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr = (ulong)uVar21 | local_4d0 << 0x20;
  ::vk::flushMappedMemoryRange
            (this->m_vki,this->m_device,
             (VkDeviceMemory)
             ((local_208.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_208.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,8);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&res_3)
  ;
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&res_3,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20
                       ,(VkSampler *)0x0);
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&bufferBarrier,pDVar17,this->m_vki,
             this->m_device,0);
  DStack_460.m_device = (VkDevice)bufferBarrier._16_8_;
  DStack_460.m_allocator = (VkAllocationCallbacks *)bufferBarrier._24_8_;
  local_468.m_internal = bufferBarrier._0_8_;
  DStack_460.m_deviceIface = (DeviceInterface *)bufferBarrier.pNext;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarrier._4_4_ = 0;
  bufferBarrier.pNext = (void *)0x0;
  bufferBarrier.srcAccessMask = 0;
  bufferBarrier.dstAccessMask = 0;
  bufferBarrier.srcQueueFamilyIndex = 0;
  bufferBarrier.dstQueueFamilyIndex = 0;
  if (local_388 != (pointer)0x0) {
    operator_delete(local_388,(long)local_378 - (long)local_388);
  }
  if ((VkAllocationCallbacks *)VStack_3a0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_3a0.m_internal,(long)local_390 - VStack_3a0.m_internal);
  }
  if (res_3.m_data._0_8_ != 0) {
    operator_delete((void *)res_3.m_data._0_8_,(long)local_3a8 - res_3.m_data._0_8_);
  }
  pDVar8 = this->m_vki;
  pVVar9 = this->m_device;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::stringbuf::str();
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&bufferBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&res_3,pDVar8,pVVar9,
             *(ProgramBinary **)(cVar18._M_node + 2),0);
  DStack_3d0.m_device = (VkDevice)local_3a8;
  DStack_3d0.m_allocator = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  local_3d8.m_internal._0_4_ = res_3.m_data[0];
  local_3d8.m_internal._4_4_ = res_3.m_data[1];
  DStack_3d0.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffc50;
  res_3.m_data[0] = 0;
  res_3.m_data[1] = 0;
  stack0xfffffffffffffc50 = (pointer)0x0;
  local_3a8 = (pointer)0x0;
  VStack_3a0.m_internal = 0;
  if ((VkAccessFlags *)bufferBarrier._0_8_ != &bufferBarrier.srcAccessMask) {
    operator_delete((void *)bufferBarrier._0_8_,bufferBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&res_3,this->m_vki,this->m_device,
                     local_468);
  obj = res_3.m_data._0_8_;
  DStack_480.m_device = (VkDevice)local_3a8;
  DStack_480.m_allocator = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  DStack_480.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffc50;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&res_3,this->m_vki,this->m_device,
                      (VkPipelineLayout)res_3.m_data._0_8_,local_3d8);
  DStack_3f0.m_device = (VkDevice)local_3a8;
  DStack_3f0.m_allocator = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  local_3f8.m_internal._0_4_ = res_3.m_data[0];
  local_3f8.m_internal._4_4_ = res_3.m_data[1];
  DStack_3f0.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffc50;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferBarrier);
  pDVar19 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&bufferBarrier,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  pDVar19 = ::vk::DescriptorPoolBuilder::addType(pDVar19,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&res_3,pDVar19,this->m_vki,this->m_device,1,1)
  ;
  DStack_410.m_device = (VkDevice)local_3a8;
  DStack_410.m_allocator = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  local_418.m_internal._0_4_ = res_3.m_data[0];
  local_418.m_internal._4_4_ = res_3.m_data[1];
  DStack_410.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffc50;
  res_3.m_data[0] = 0;
  res_3.m_data[1] = 0;
  stack0xfffffffffffffc50 = (pointer)0x0;
  local_3a8 = (pointer)0x0;
  VStack_3a0.m_internal = 0;
  if (bufferBarrier._0_8_ != 0) {
    operator_delete((void *)bufferBarrier._0_8_,bufferBarrier._16_8_ - bufferBarrier._0_8_);
  }
  makeBufferMemoryBarrier
            (&bufferBarrier,0x40,0x2000,
             (VkBuffer)
             local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&res_3,this->m_vki,this->m_device,
                  this->m_queueFamilyIndex);
  DStack_430.m_device = (VkDevice)local_3a8;
  DStack_430.m_allocator = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  local_438.m_internal._0_4_ = res_3.m_data[0];
  local_438.m_internal._4_4_ = res_3.m_data[1];
  DStack_430.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffc50;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&res_3,this->m_vki,this->m_device,
             (VkCommandPool)res_3.m_data._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  commandBuffer = res_3.m_data._0_8_;
  local_4e8 = stack0xfffffffffffffc50;
  local_4e0 = local_3a8;
  local_4d8 = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  beginCommandBuffer(this->m_vki,(VkCommandBuffer)res_3.m_data._0_8_);
  (*this->m_vki->_vptr_DeviceInterface[0x4c])(this->m_vki,commandBuffer,1,local_3f8.m_internal);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&res_3,this->m_vki,this->m_device,
                    local_418,local_468);
  local_508 = local_3a8;
  pVStack_500 = (VkAllocationCallbacks *)VStack_3a0.m_internal;
  local_518._0_4_ = res_3.m_data[0];
  local_518._4_4_ = res_3.m_data[1];
  pWStack_510 = stack0xfffffffffffffc50;
  uniformDescriptorInfo.buffer.m_internal =
       local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  uniformDescriptorInfo.offset = 0;
  uniformDescriptorInfo.range = 8;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&res_3)
  ;
  pDVar20 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&res_3,(int)local_518,(void *)0x0,0);
  pDVar20 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write(pDVar20,(int)local_518,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar20,this->m_vki,this->m_device);
  if (local_388 != (pointer)0x0) {
    operator_delete(local_388,(long)local_378 - (long)local_388);
  }
  if ((VkAllocationCallbacks *)VStack_3a0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_3a0.m_internal,(long)local_390 - VStack_3a0.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&res_3);
  (*this->m_vki->_vptr_DeviceInterface[0x56])(this->m_vki,commandBuffer,1,obj,0,1,&local_518,0,0);
  (*this->m_vki->_vptr_DeviceInterface[0x5d])
            (this->m_vki,commandBuffer,(ulong)(pSVar1->m_numWorkGroups).m_data[0],
             (ulong)(pSVar1->m_numWorkGroups).m_data[1],(ulong)(pSVar1->m_numWorkGroups).m_data[2]);
  (*this->m_vki->_vptr_DeviceInterface[0x6d])
            (this->m_vki,commandBuffer,0x800,0x4000,0,0,0,1,&bufferBarrier,0,0);
  endCommandBuffer(this->m_vki,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(this->m_vki,this->m_device,this->m_queue,(VkCommandBuffer)commandBuffer);
  pAVar11 = local_238.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (this->m_vki,this->m_device,
             (VkDeviceMemory)
             ((local_238.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_238.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pTVar10 = ((this->super_TestInstance).m_context)->m_testCtx;
  uVar25 = (pSVar1->m_numWorkGroups).m_data[2];
  if (uVar25 == 0) {
    local_5b4 = 0;
  }
  else {
    local_440 = pAVar11->m_hostPtr;
    local_448 = (ulong)uVar12 << 2;
    poVar5 = (ostringstream *)(res_3.m_data + 2);
    uVar14 = (pSVar1->m_numWorkGroups).m_data[1];
    uVar26 = 0;
    local_5b4 = 0;
    uVar23 = uVar14;
    do {
      if (uVar23 == 0) {
        uVar23 = 0;
      }
      else {
        uVar25 = pUVar2->m_data[0];
        local_59c = 0;
        uVar23 = uVar25;
        do {
          if (uVar23 == 0) {
            uVar23 = 0;
          }
          else {
            uVar14 = (pSVar1->m_localSize).m_data[2];
            local_598 = 0;
            uVar23 = uVar14;
            do {
              if (uVar23 == 0) {
                uVar23 = 0;
              }
              else {
                uVar25 = (pSVar1->m_localSize).m_data[1];
                local_594 = 0;
                uVar23 = uVar25;
                do {
                  if (uVar23 == 0) {
                    uVar23 = 0;
                  }
                  else {
                    uVar14 = (pSVar1->m_localSize).m_data[0];
                    local_590 = 0;
                    do {
                      if (uVar14 == 0) {
                        uVar14 = 0;
                      }
                      else {
                        uVar25 = 0;
                        do {
                          refGroupID.m_data[0] = local_598;
                          refGroupID.m_data[1] = local_59c;
                          refGroupID.m_data[2] = uVar26;
                          refLocalID.m_data[0] = uVar25;
                          refLocalID.m_data[1] = local_590;
                          refLocalID.m_data[2] = local_594;
                          stack0xfffffffffffffc50 =
                               (pointer)((ulong)stack0xfffffffffffffc50 & 0xffffffff00000000);
                          res_3.m_data[0] = 0;
                          res_3.m_data[1] = 0;
                          lVar15 = 0;
                          do {
                            res_3.m_data[lVar15] =
                                 (pSVar1->m_localSize).m_data[lVar15] * refGroupID.m_data[lVar15];
                            lVar15 = lVar15 + 1;
                          } while (lVar15 != 3);
                          refGlobalID.m_data[2] = 0;
                          refGlobalID.m_data[0] = 0;
                          refGlobalID.m_data[1] = 0;
                          lVar15 = 0;
                          do {
                            refGlobalID.m_data[lVar15] =
                                 refLocalID.m_data[lVar15] + res_3.m_data[lVar15];
                            lVar15 = lVar15 + 1;
                          } while (lVar15 != 3);
                          iVar27 = refGlobalID.m_data[1] * (int)local_4d0 +
                                   refGlobalID.m_data[2] * uVar21 + refGlobalID.m_data[0];
                          (*(this->m_builtin_var_case->super_TestCase).super_TestCase.super_TestNode
                            ._vptr_TestNode[7])
                                    (&refValue,this->m_builtin_var_case,pUVar2,pSVar1,&refGroupID,
                                     &refLocalID);
                          resValue.m_data[2] = 0;
                          resValue.m_data[0] = 0;
                          resValue.m_data[1] = 0;
                          if ((int)uVar12 < 1) {
                            uVar14 = 0;
LAB_0071cdda:
                            if (refValue.m_data[0] != uVar14) {
                              bVar28 = false;
LAB_0071cdeb:
                              if (local_5b4 < 10) {
                                res_3.m_data._0_8_ = pTVar10->m_log;
                                std::__cxx11::ostringstream::ostringstream(poVar5);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)poVar5,"ERROR: comparison failed at offset ",
                                           0x23);
                                std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)poVar5,": expected ",0xb);
                                if (bVar28) {
                                  tcu::operator<<((ostream *)poVar5,&refValue);
                                }
                                else {
                                  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)poVar5,", got ",6);
                                if (bVar28) {
                                  tcu::operator<<((ostream *)poVar5,&resValue);
                                }
                                else {
                                  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                                }
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)&res_3,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0071cf3e:
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)(res_3.m_data + 2));
                                std::ios_base::~ios_base(local_340);
                              }
                              else if (local_5b4 == 10) {
                                res_3.m_data._0_8_ = pTVar10->m_log;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)(res_3.m_data + 2));
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)(res_3.m_data + 2),"...",3);
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)&res_3,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                                goto LAB_0071cf3e;
                              }
                              local_5b4 = local_5b4 + 1;
                            }
                          }
                          else {
                            memcpy(&resValue,
                                   (void *)((ulong)(uint)(iVar27 * local_5a0) + (long)local_440),
                                   local_448);
                            if (uVar12 != 3) {
                              uVar14 = resValue.m_data[0];
                              goto LAB_0071cdda;
                            }
                            bVar28 = true;
                            lVar15 = 0;
                            do {
                              while (!bVar28) {
                                lVar15 = lVar15 + 1;
                                bVar28 = false;
                                if (lVar15 == 3) {
                                  bVar28 = true;
                                  goto LAB_0071cdeb;
                                }
                              }
                              puVar3 = refValue.m_data + lVar15;
                              puVar4 = resValue.m_data + lVar15;
                              bVar28 = *puVar3 == *puVar4;
                              lVar15 = lVar15 + 1;
                            } while (lVar15 != 3);
                            bVar28 = true;
                            if (*puVar3 != *puVar4) goto LAB_0071cdeb;
                          }
                          uVar25 = uVar25 + 1;
                          uVar14 = (pSVar1->m_localSize).m_data[0];
                        } while (uVar25 < uVar14);
                        uVar25 = (pSVar1->m_localSize).m_data[1];
                      }
                      local_590 = local_590 + 1;
                    } while (local_590 < uVar25);
                    uVar14 = (pSVar1->m_localSize).m_data[2];
                    uVar23 = uVar25;
                  }
                  local_594 = local_594 + 1;
                } while (local_594 < uVar14);
                uVar25 = pUVar2->m_data[0];
                uVar23 = uVar14;
              }
              local_598 = local_598 + 1;
            } while (local_598 < uVar25);
            uVar14 = (pSVar1->m_numWorkGroups).m_data[1];
            uVar23 = uVar25;
          }
          local_59c = local_59c + 1;
        } while (local_59c < uVar14);
        uVar25 = (pSVar1->m_numWorkGroups).m_data[2];
        uVar23 = uVar14;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < uVar25);
  }
  res_3.m_data._0_8_ = pTVar10->m_log;
  poVar5 = (ostringstream *)(res_3.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," / ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_340);
  pTVar24 = local_4f0;
  if (local_5b4 < 1) {
    iVar27 = this->m_subCaseNdx + 1;
    this->m_subCaseNdx = iVar27;
    iVar22 = (int)((ulong)((long)(this->m_subCases).
                                 super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_subCases).
                                super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (SBORROW4(iVar27,iVar22 * -0x55555555) != iVar27 + iVar22 * 0x55555555 < 0) {
      tcu::TestStatus::incomplete();
      goto LAB_0071d1a2;
    }
    res_3.m_data._0_8_ = &local_3a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res_3,"Comparison succeeded","");
    pTVar24->m_code = QP_TEST_RESULT_PASS;
    (pTVar24->m_description)._M_dataplus._M_p = (pointer)&(pTVar24->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar24->m_description,res_3.m_data._0_8_,
               (long)&(stack0xfffffffffffffc50->imageInfos).
                      super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start + res_3.m_data._0_8_);
  }
  else {
    res_3.m_data._0_8_ = &local_3a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res_3,"Comparison failed","");
    pTVar24 = local_4f0;
    local_4f0->m_code = QP_TEST_RESULT_FAIL;
    (local_4f0->m_description)._M_dataplus._M_p = (pointer)&(local_4f0->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f0->m_description,res_3.m_data._0_8_,
               (long)&(stack0xfffffffffffffc50->imageInfos).
                      super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start + res_3.m_data._0_8_);
  }
  if ((pointer *)res_3.m_data._0_8_ != &local_3a8) {
    operator_delete((void *)res_3.m_data._0_8_,
                    (ulong)((long)&(local_3a8->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_0071d1a2:
  if (local_518 != 0) {
    res_3.m_data[0] = (undefined4)local_518;
    res_3.m_data[1] = local_518._4_4_;
    (*(code *)(pWStack_510->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_510,local_508,pVStack_500,1);
  }
  if (commandBuffer != 0) {
    res_3.m_data._0_8_ = commandBuffer;
    (*(code *)(local_4e8->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (local_4e8,local_4e0,local_4d8,1);
  }
  if (local_438.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_430,local_438);
  }
  if (local_418.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_410,local_418);
  }
  if (local_3f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_3f0,local_3f8);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_480,(VkPipelineLayout)obj);
  }
  if (local_3d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3d0,local_3d8);
  }
  if (local_468.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_460,local_468);
  }
  if (local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_238.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_238.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_238.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  if (local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program_name);
  std::ios_base::~ios_base(local_138);
  return pTVar24;
}

Assistant:

tcu::TestStatus	ComputeBuiltinVarInstance::iterate (void)
{
	std::ostringstream program_name;
	program_name << s_prefixProgramName << m_subCaseNdx;

	const SubCase&				subCase				= m_subCases[m_subCaseNdx];
	const tcu::UVec3			globalSize			= subCase.localSize()*subCase.numWorkGroups();
	const tcu::UVec2			stride				(globalSize[0] * globalSize[1], globalSize[0]);
	const deUint32				sizeOfUniformBuffer	= sizeof(stride);
	const int					numScalars			= glu::getDataTypeScalarSize(m_varType);
	const deUint32				numInvocations		= subCase.localSize()[0] * subCase.localSize()[1] * subCase.localSize()[2] * subCase.numWorkGroups()[0] * subCase.numWorkGroups()[1] * subCase.numWorkGroups()[2];

	deUint32					resultBufferStride = 0;
	switch (m_varType)
	{
		case glu::TYPE_UINT:
			resultBufferStride = sizeof(deUint32);
			break;
		case glu::TYPE_UINT_VEC2:
			resultBufferStride = sizeof(tcu::UVec2);
			break;
		case glu::TYPE_UINT_VEC3:
		case glu::TYPE_UINT_VEC4:
			resultBufferStride = sizeof(tcu::UVec4);
			break;
		default:
			DE_ASSERT("Illegal data type");
	}

	const deUint32				resultBufferSize	= numInvocations * resultBufferStride;

	// Create result buffer
	Buffer uniformBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(sizeOfUniformBuffer, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);
	Buffer resultBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(resultBufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = uniformBuffer.getAllocation();
		memcpy(alloc.getHostPtr(), &stride, sizeOfUniformBuffer);
		flushMappedMemoryRange(m_vki, m_device, alloc.getMemory(), alloc.getOffset(), sizeOfUniformBuffer);
	}

	// Create descriptorSetLayout
	const Unique<VkDescriptorSetLayout>	descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(m_vki, m_device));

	const Unique<VkShaderModule> shaderModule(createShaderModule(m_vki, m_device, m_context.getBinaryCollection().get(program_name.str()), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(m_vki, m_device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(m_vki, m_device, *pipelineLayout, *shaderModule));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(m_vki, m_device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkBufferMemoryBarrier bufferBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(m_vki, m_device, m_queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_vki, m_device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(m_vki, *cmdBuffer);

	m_vki.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	// Create descriptor set
	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(m_vki, m_device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, 0ull, resultBufferSize);
	const VkDescriptorBufferInfo uniformDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, sizeOfUniformBuffer);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo)
		.update(m_vki, m_device);

	m_vki.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	// Dispatch indirect compute command
	m_vki.cmdDispatch(*cmdBuffer, subCase.numWorkGroups()[0], subCase.numWorkGroups()[1], subCase.numWorkGroups()[2]);

	m_vki.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
							 0, (const VkMemoryBarrier*)DE_NULL,
							 1, &bufferBarrier,
							 0, (const VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_vki, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_vki, m_device, m_queue, *cmdBuffer);

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(m_vki, m_device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSize);

	const deUint8*	 ptr = reinterpret_cast<deUint8*>(resultAlloc.getHostPtr());

	int			numFailed		= 0;
	const int	maxLogPrints	= 10;

	tcu::TestContext& testCtx	= m_context.getTestContext();

	for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups().z(); groupZ++)
	for (deUint32 groupY = 0; groupY < subCase.numWorkGroups().y(); groupY++)
	for (deUint32 groupX = 0; groupX < subCase.numWorkGroups().x(); groupX++)
	for (deUint32 localZ = 0; localZ < subCase.localSize().z(); localZ++)
	for (deUint32 localY = 0; localY < subCase.localSize().y(); localY++)
	for (deUint32 localX = 0; localX < subCase.localSize().x(); localX++)
	{
		const UVec3			refGroupID(groupX, groupY, groupZ);
		const UVec3			refLocalID(localX, localY, localZ);
		const UVec3			refGlobalID = refGroupID * subCase.localSize() + refLocalID;

		const deUint32		refOffset = stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();

		const UVec3			refValue = m_builtin_var_case->computeReference(subCase.numWorkGroups(), subCase.localSize(), refGroupID, refLocalID);

		const deUint32*		resPtr = (const deUint32*)(ptr + refOffset * resultBufferStride);
		const UVec3			resValue = readResultVec(resPtr, numScalars);

		if (!compareNumComponents(refValue, resValue, numScalars))
		{
			if (numFailed < maxLogPrints)
				testCtx.getLog()
				<< TestLog::Message
				<< "ERROR: comparison failed at offset " << refOffset
				<< ": expected " << LogComps(refValue, numScalars)
				<< ", got " << LogComps(resValue, numScalars)
				<< TestLog::EndMessage;
			else if (numFailed == maxLogPrints)
				testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

			numFailed += 1;
		}
	}

	testCtx.getLog() << TestLog::Message << (numInvocations - numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

	if (numFailed > 0)
		return tcu::TestStatus::fail("Comparison failed");

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size()) ? tcu::TestStatus::incomplete() :tcu::TestStatus::pass("Comparison succeeded");
}